

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  size_t *psVar3;
  int iVar4;
  pointer pBVar5;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  pointer pMVar9;
  long *plVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Layer *pLVar14;
  undefined4 extraout_var;
  size_t sVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  int local_3f8;
  int local_3f4;
  Layer *local_3f0;
  Mat local_3e8;
  int local_3a0;
  int local_39c;
  ulong local_398;
  Net *local_390;
  DataReader *local_388;
  ulong local_380;
  vector<int,_std::allocator<int>_> *local_378;
  int local_36c;
  string *local_368;
  vector<int,_std::allocator<int>_> *local_360;
  pointer local_358;
  ParamDict local_350;
  ulong local_340;
  Mat local_338 [3];
  char local_238 [256];
  char local_138 [264];
  
  local_36c = 0;
  iVar13 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar13 == 1) {
    if (local_36c == 0x7685dd) {
      local_39c = 0;
      local_3a0 = 0;
      iVar13 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar13 == 1) {
        iVar13 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3a0);
        if (iVar13 == 1) {
          if ((0 < (long)local_39c) && (0 < local_3a0)) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)local_39c);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)local_3a0);
            ParamDict::ParamDict(&local_350);
            if (0 < local_39c) {
              uVar18 = 0;
              local_398 = 0;
              local_390 = this;
              local_388 = dr;
              do {
                local_3f4 = 0;
                local_3f8 = 0;
                iVar13 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_238);
                if (iVar13 != 1) {
                  load_param();
LAB_00149599:
                  iVar13 = -1;
                  goto LAB_0014959e;
                }
                iVar13 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_138);
                if (iVar13 != 1) {
                  load_param();
                  goto LAB_00149599;
                }
                iVar13 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3f4);
                if (iVar13 != 1) {
                  load_param();
                  goto LAB_00149599;
                }
                iVar13 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_3f8);
                if (iVar13 != 1) {
                  load_param();
                  goto LAB_00149599;
                }
                pLVar14 = create_layer(local_238);
                if (pLVar14 == (Layer *)0x0) {
                  iVar13 = (*this->_vptr_Net[3])(this,local_238);
                  pLVar14 = (Layer *)CONCAT44(extraout_var,iVar13);
                  if (pLVar14 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %s not exists or registered",local_238);
                    fputc(10,_stderr);
                    clear(this);
                    goto LAB_00149599;
                  }
                }
                psVar3 = &local_338[0].elemsize;
                local_3f0 = pLVar14;
                local_338[0].data = psVar3;
                sVar15 = strlen(local_238);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_238,local_238 + sVar15);
                std::__cxx11::string::operator=((string *)&local_3f0->type,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar3) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_338[0].data = psVar3;
                sVar15 = strlen(local_138);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_338,local_138,local_138 + sVar15);
                pLVar14 = local_3f0;
                local_368 = &local_3f0->name;
                std::__cxx11::string::operator=((string *)local_368,(string *)local_338);
                if ((size_t *)local_338[0].data != psVar3) {
                  operator_delete(local_338[0].data,local_338[0].elemsize + 1);
                }
                local_360 = &pLVar14->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_360,(long)local_3f4);
                local_380 = uVar18;
                if (0 < local_3f4) {
                  lVar19 = 0;
                  do {
                    iVar13 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_338);
                    if (iVar13 != 1) {
                      load_param();
                      goto LAB_00149599;
                    }
                    iVar13 = find_blob_index_by_name(this,(char *)local_338);
                    if (iVar13 == -1) {
                      pBVar5 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      local_3e8.data = &local_3e8.elemsize;
                      sVar15 = strlen((char *)local_338);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3e8,local_338,(long)&local_338[0].data + sVar15);
                      lVar16 = (long)(int)local_398;
                      std::__cxx11::string::operator=
                                ((string *)(pBVar5 + lVar16),(string *)&local_3e8);
                      if ((size_t *)local_3e8.data != &local_3e8.elemsize) {
                        operator_delete(local_3e8.data,
                                        CONCAT44(local_3e8.elemsize._4_4_,
                                                 (undefined4)local_3e8.elemsize) + 1);
                      }
                      iVar13 = (int)local_398;
                      local_398 = (ulong)(iVar13 + 1);
                      this = local_390;
                    }
                    else {
                      lVar16 = (long)iVar13;
                    }
                    (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar16].consumer = (int)local_380;
                    (local_360->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = iVar13;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 < local_3f4);
                }
                pLVar14 = local_3f0;
                local_378 = &local_3f0->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_378,(long)local_3f8);
                uVar18 = local_380;
                if (0 < local_3f8) {
                  lVar16 = (long)(int)local_398 * 0x70;
                  local_340 = local_398 & 0xffffffff;
                  lVar19 = 0;
                  do {
                    local_358 = (this->d->blobs).
                                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                                super__Vector_impl_data._M_start;
                    iVar13 = (*local_388->_vptr_DataReader[2])(local_388,"%255s",local_338);
                    if (iVar13 != 1) {
                      load_param();
                      goto LAB_00149599;
                    }
                    local_3e8.data = &local_3e8.elemsize;
                    sVar15 = strlen((char *)local_338);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3e8,local_338,(long)&local_338[0].data + sVar15);
                    std::__cxx11::string::operator=
                              ((string *)((long)&(local_358->name)._M_dataplus._M_p + lVar16),
                               (string *)&local_3e8);
                    if ((size_t *)local_3e8.data != &local_3e8.elemsize) {
                      operator_delete(local_3e8.data,
                                      CONCAT44(local_3e8.elemsize._4_4_,
                                               (undefined4)local_3e8.elemsize) + 1);
                    }
                    *(int *)((long)&local_358->producer + lVar16) = (int)uVar18;
                    (local_378->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar19] = (int)local_340 + (int)lVar19;
                    lVar19 = lVar19 + 1;
                    lVar16 = lVar16 + 0x70;
                    this = local_390;
                  } while (lVar19 < local_3f8);
                  local_398 = (ulong)(uint)((int)local_398 + (int)lVar19);
                  pLVar14 = local_3f0;
                  dr = local_388;
                }
                iVar13 = ParamDict::load_param(&local_350,dr);
                if (iVar13 == 0) {
                  if (pLVar14->support_int8_storage == true) {
                    (this->opt).use_vulkan_compute = false;
                  }
                  local_3e8.cstep = 0;
                  local_3e8.data = (size_t *)0x0;
                  local_3e8.refcount._0_4_ = 0;
                  local_3e8.refcount._4_4_ = 0;
                  local_3e8.elemsize._0_4_ = 0;
                  local_3e8.elemsize._4_4_ = 0;
                  local_3e8.elempack = 0;
                  local_3e8.h = 0;
                  local_3e8.d = 0;
                  local_3e8.c = 0;
                  local_3e8.allocator = (Allocator *)0x0;
                  local_3e8.dims = 0;
                  local_3e8.w = 0;
                  ParamDict::get(local_338,&local_350,0x1e,&local_3e8);
                  piVar17 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_);
                  if (piVar17 != (int *)0x0) {
                    LOCK();
                    *piVar17 = *piVar17 + -1;
                    UNLOCK();
                    if (*piVar17 == 0) {
                      if (local_3e8.allocator == (Allocator *)0x0) {
                        if ((size_t *)local_3e8.data != (size_t *)0x0) {
                          free(local_3e8.data);
                        }
                      }
                      else {
                        (*(local_3e8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((((size_t *)local_338[0].data != (size_t *)0x0) &&
                      ((long)local_338[0].c * local_338[0].cstep != 0)) && (0 < local_3f8)) {
                    piVar17 = (int *)((long)local_338[0].data + 0xc);
                    lVar19 = 0;
                    do {
                      iVar13 = (local_378->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar19];
                      pBVar5 = (local_390->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar4 = piVar17[-3];
                      if (iVar4 == 3) {
                        local_3e8.w = piVar17[-2];
                        local_3e8.h = piVar17[-1];
                        local_3e8.c = *piVar17;
                        local_3e8.data = (size_t *)0x0;
                        local_3e8.refcount._0_4_ = 0;
                        local_3e8.refcount._4_4_ = 0;
                        local_3e8.elemsize._0_4_ = 4;
                        local_3e8.elemsize._4_4_ = 0;
                        local_3e8.elempack = 1;
                        local_3e8.allocator = (Allocator *)0x0;
                        local_3e8.dims = 3;
                        local_3e8.d = 1;
                        local_3e8.cstep =
                             (long)local_3e8.h * (long)local_3e8.w + 3U & 0x3ffffffffffffffc;
                        if (&pBVar5[iVar13].shape != &local_3e8) {
                          piVar6 = pBVar5[iVar13].shape.refcount;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              pvVar7 = pBVar5[iVar13].shape.data;
                              pAVar8 = pBVar5[iVar13].shape.allocator;
                              if (pAVar8 == (Allocator *)0x0) {
                                if (pvVar7 != (void *)0x0) {
                                  free(pvVar7);
                                }
                              }
                              else {
                                (*pAVar8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar5[iVar13].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                          pBVar5[iVar13].shape.data = (void *)0x0;
                          pBVar5[iVar13].shape.refcount = (int *)0x0;
                          pBVar5[iVar13].shape.dims = 0;
                          pBVar5[iVar13].shape.w = 0;
                          pBVar5[iVar13].shape.h = 0;
                          pBVar5[iVar13].shape.d = 0;
                          pBVar5[iVar13].shape.c = 0;
                          pBVar5[iVar13].shape.data = local_3e8.data;
                          piVar6 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_
                                                  );
                          pBVar5[iVar13].shape.refcount = piVar6;
                          pBVar5[iVar13].shape.elemsize =
                               CONCAT44(local_3e8.elemsize._4_4_,(undefined4)local_3e8.elemsize);
                          pBVar5[iVar13].shape.elempack = local_3e8.elempack;
                          pBVar5[iVar13].shape.allocator = local_3e8.allocator;
                          pBVar5[iVar13].shape.dims = local_3e8.dims;
                          pBVar5[iVar13].shape.w = local_3e8.w;
                          pBVar5[iVar13].shape.h = local_3e8.h;
                          pBVar5[iVar13].shape.d = local_3e8.d;
                          pBVar5[iVar13].shape.c = local_3e8.c;
                          pBVar5[iVar13].shape.cstep = local_3e8.cstep;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              if (local_3e8.allocator == (Allocator *)0x0) {
LAB_00149223:
                                if ((size_t *)local_3e8.data != (size_t *)0x0) {
                                  free(local_3e8.data);
                                }
                              }
                              else {
                                (*(local_3e8.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                        }
                      }
                      else if (iVar4 == 2) {
                        local_3e8.w = piVar17[-2];
                        local_3e8.h = piVar17[-1];
                        local_3e8.data = (size_t *)0x0;
                        local_3e8.refcount._0_4_ = 0;
                        local_3e8.refcount._4_4_ = 0;
                        local_3e8.elemsize._0_4_ = 4;
                        local_3e8.elemsize._4_4_ = 0;
                        local_3e8.elempack = 1;
                        local_3e8.allocator = (Allocator *)0x0;
                        local_3e8.dims = 2;
                        local_3e8.d = 1;
                        local_3e8.c = 1;
                        local_3e8.cstep = (long)local_3e8.h * (long)local_3e8.w;
                        if (&pBVar5[iVar13].shape != &local_3e8) {
                          piVar6 = pBVar5[iVar13].shape.refcount;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              pvVar7 = pBVar5[iVar13].shape.data;
                              pAVar8 = pBVar5[iVar13].shape.allocator;
                              if (pAVar8 == (Allocator *)0x0) {
                                if (pvVar7 != (void *)0x0) {
                                  free(pvVar7);
                                }
                              }
                              else {
                                (*pAVar8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar5[iVar13].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                          pBVar5[iVar13].shape.data = (void *)0x0;
                          pBVar5[iVar13].shape.refcount = (int *)0x0;
                          pBVar5[iVar13].shape.dims = 0;
                          pBVar5[iVar13].shape.w = 0;
                          pBVar5[iVar13].shape.h = 0;
                          pBVar5[iVar13].shape.d = 0;
                          pBVar5[iVar13].shape.c = 0;
                          pBVar5[iVar13].shape.data = local_3e8.data;
                          piVar6 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_
                                                  );
                          pBVar5[iVar13].shape.refcount = piVar6;
                          pBVar5[iVar13].shape.elemsize =
                               CONCAT44(local_3e8.elemsize._4_4_,(undefined4)local_3e8.elemsize);
                          pBVar5[iVar13].shape.elempack = local_3e8.elempack;
                          pBVar5[iVar13].shape.allocator = local_3e8.allocator;
                          pBVar5[iVar13].shape.dims = local_3e8.dims;
                          pBVar5[iVar13].shape.w = local_3e8.w;
                          pBVar5[iVar13].shape.h = local_3e8.h;
                          pBVar5[iVar13].shape.d = local_3e8.d;
                          pBVar5[iVar13].shape.c = local_3e8.c;
                          pBVar5[iVar13].shape.cstep = local_3e8.cstep;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              if (local_3e8.allocator == (Allocator *)0x0) goto LAB_00149223;
                              (*(local_3e8.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      else if (iVar4 == 1) {
                        local_3e8.w = piVar17[-2];
                        local_3e8.cstep = (size_t)local_3e8.w;
                        local_3e8.data = (size_t *)0x0;
                        local_3e8.refcount._0_4_ = 0;
                        local_3e8.refcount._4_4_ = 0;
                        local_3e8.elemsize._0_4_ = 4;
                        local_3e8.elemsize._4_4_ = 0;
                        local_3e8.elempack = 1;
                        local_3e8.allocator = (Allocator *)0x0;
                        local_3e8.dims = 1;
                        local_3e8.h = 1;
                        local_3e8.d = 1;
                        local_3e8.c = 1;
                        if (&pBVar5[iVar13].shape != &local_3e8) {
                          piVar6 = pBVar5[iVar13].shape.refcount;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              pvVar7 = pBVar5[iVar13].shape.data;
                              pAVar8 = pBVar5[iVar13].shape.allocator;
                              if (pAVar8 == (Allocator *)0x0) {
                                if (pvVar7 != (void *)0x0) {
                                  free(pvVar7);
                                }
                              }
                              else {
                                (*pAVar8->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pBVar5[iVar13].shape.cstep = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar5[iVar13].shape.elemsize + 4) = 0;
                          pBVar5[iVar13].shape.data = (void *)0x0;
                          pBVar5[iVar13].shape.refcount = (int *)0x0;
                          pBVar5[iVar13].shape.dims = 0;
                          pBVar5[iVar13].shape.w = 0;
                          pBVar5[iVar13].shape.h = 0;
                          pBVar5[iVar13].shape.d = 0;
                          pBVar5[iVar13].shape.c = 0;
                          pBVar5[iVar13].shape.data = local_3e8.data;
                          piVar6 = (int *)CONCAT44(local_3e8.refcount._4_4_,local_3e8.refcount._0_4_
                                                  );
                          pBVar5[iVar13].shape.refcount = piVar6;
                          pBVar5[iVar13].shape.elemsize =
                               CONCAT44(local_3e8.elemsize._4_4_,(undefined4)local_3e8.elemsize);
                          pBVar5[iVar13].shape.elempack = local_3e8.elempack;
                          pBVar5[iVar13].shape.allocator = local_3e8.allocator;
                          pBVar5[iVar13].shape.dims = local_3e8.dims;
                          pBVar5[iVar13].shape.w = local_3e8.w;
                          pBVar5[iVar13].shape.h = local_3e8.h;
                          pBVar5[iVar13].shape.d = local_3e8.d;
                          pBVar5[iVar13].shape.c = local_3e8.c;
                          pBVar5[iVar13].shape.cstep = local_3e8.cstep;
                          if (piVar6 != (int *)0x0) {
                            LOCK();
                            *piVar6 = *piVar6 + -1;
                            UNLOCK();
                            if (*piVar6 == 0) {
                              if (local_3e8.allocator == (Allocator *)0x0) goto LAB_00149223;
                              (*(local_3e8.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                      }
                      lVar19 = lVar19 + 1;
                      piVar17 = piVar17 + 4;
                    } while (lVar19 < local_3f8);
                  }
                  pvVar1 = &local_3f0->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_3f4)
                  ;
                  if (0 < local_3f4) {
                    lVar16 = 0;
                    lVar19 = 0;
                    iVar13 = local_3f4;
                    do {
                      iVar4 = (local_360->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar5 = (local_390->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar9 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar9->data + lVar16);
                      if ((Mat *)puVar2 != &pBVar5[iVar4].shape) {
                        piVar17 = pBVar5[iVar4].shape.refcount;
                        if (piVar17 != (int *)0x0) {
                          LOCK();
                          *piVar17 = *piVar17 + 1;
                          UNLOCK();
                        }
                        piVar17 = *(int **)((long)&pMVar9->refcount + lVar16);
                        if (piVar17 != (int *)0x0) {
                          LOCK();
                          *piVar17 = *piVar17 + -1;
                          UNLOCK();
                          if (*piVar17 == 0) {
                            pvVar7 = *(void **)((long)&pMVar9->data + lVar16);
                            plVar10 = *(long **)((long)&pMVar9->allocator + lVar16);
                            if (plVar10 == (long *)0x0) {
                              if (pvVar7 != (void *)0x0) {
                                free(pvVar7);
                              }
                            }
                            else {
                              (**(code **)(*plVar10 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar9->cstep + lVar16) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar16);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar9->c + lVar16) = 0;
                        piVar17 = pBVar5[iVar4].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar9->data + lVar16);
                        *puVar2 = pBVar5[iVar4].shape.data;
                        puVar2[1] = piVar17;
                        *(size_t *)((long)&pMVar9->elemsize + lVar16) = pBVar5[iVar4].shape.elemsize
                        ;
                        *(int *)((long)&pMVar9->elempack + lVar16) = pBVar5[iVar4].shape.elempack;
                        *(Allocator **)((long)&pMVar9->allocator + lVar16) =
                             pBVar5[iVar4].shape.allocator;
                        iVar13 = pBVar5[iVar4].shape.w;
                        iVar11 = pBVar5[iVar4].shape.h;
                        iVar12 = pBVar5[iVar4].shape.d;
                        piVar17 = (int *)((long)&pMVar9->dims + lVar16);
                        *piVar17 = pBVar5[iVar4].shape.dims;
                        piVar17[1] = iVar13;
                        piVar17[2] = iVar11;
                        piVar17[3] = iVar12;
                        *(int *)((long)&pMVar9->c + lVar16) = pBVar5[iVar4].shape.c;
                        *(size_t *)((long)&pMVar9->cstep + lVar16) = pBVar5[iVar4].shape.cstep;
                        iVar13 = local_3f4;
                      }
                      lVar19 = lVar19 + 1;
                      lVar16 = lVar16 + 0x48;
                    } while (lVar19 < iVar13);
                  }
                  this = local_390;
                  pvVar1 = &local_3f0->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_3f8)
                  ;
                  if (0 < local_3f8) {
                    lVar16 = 0;
                    lVar19 = 0;
                    iVar13 = local_3f8;
                    do {
                      iVar4 = (local_378->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar5 = (this->d->blobs).
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar9 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar9->data + lVar16);
                      if ((Mat *)puVar2 != &pBVar5[iVar4].shape) {
                        piVar17 = pBVar5[iVar4].shape.refcount;
                        if (piVar17 != (int *)0x0) {
                          LOCK();
                          *piVar17 = *piVar17 + 1;
                          UNLOCK();
                        }
                        piVar17 = *(int **)((long)&pMVar9->refcount + lVar16);
                        if (piVar17 != (int *)0x0) {
                          LOCK();
                          *piVar17 = *piVar17 + -1;
                          UNLOCK();
                          if (*piVar17 == 0) {
                            pvVar7 = *(void **)((long)&pMVar9->data + lVar16);
                            plVar10 = *(long **)((long)&pMVar9->allocator + lVar16);
                            if (plVar10 == (long *)0x0) {
                              if (pvVar7 != (void *)0x0) {
                                free(pvVar7);
                              }
                            }
                            else {
                              (**(code **)(*plVar10 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)&pMVar9->cstep + lVar16) = 0;
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar9->dims + lVar16);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&pMVar9->c + lVar16) = 0;
                        piVar17 = pBVar5[iVar4].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar9->data + lVar16);
                        *puVar2 = pBVar5[iVar4].shape.data;
                        puVar2[1] = piVar17;
                        *(size_t *)((long)&pMVar9->elemsize + lVar16) = pBVar5[iVar4].shape.elemsize
                        ;
                        *(int *)((long)&pMVar9->elempack + lVar16) = pBVar5[iVar4].shape.elempack;
                        *(Allocator **)((long)&pMVar9->allocator + lVar16) =
                             pBVar5[iVar4].shape.allocator;
                        iVar13 = pBVar5[iVar4].shape.w;
                        iVar11 = pBVar5[iVar4].shape.h;
                        iVar12 = pBVar5[iVar4].shape.d;
                        piVar17 = (int *)((long)&pMVar9->dims + lVar16);
                        *piVar17 = pBVar5[iVar4].shape.dims;
                        piVar17[1] = iVar13;
                        piVar17[2] = iVar11;
                        piVar17[3] = iVar12;
                        *(int *)((long)&pMVar9->c + lVar16) = pBVar5[iVar4].shape.c;
                        *(size_t *)((long)&pMVar9->cstep + lVar16) = pBVar5[iVar4].shape.cstep;
                        iVar13 = local_3f8;
                      }
                      lVar19 = lVar19 + 1;
                      lVar16 = lVar16 + 0x48;
                      this = local_390;
                    } while (lVar19 < iVar13);
                  }
                  pLVar14 = local_3f0;
                  iVar13 = (*local_3f0->_vptr_Layer[2])(local_3f0,&local_350);
                  uVar18 = local_380;
                  dr = local_388;
                  if (iVar13 == 0) {
                    (this->d->layers).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_380] = pLVar14;
                    iVar13 = 0;
                  }
                  else {
                    load_param();
                    iVar13 = 0xe;
                  }
                  if (local_338[0].refcount != (int *)0x0) {
                    LOCK();
                    *local_338[0].refcount = *local_338[0].refcount + -1;
                    UNLOCK();
                    if (*local_338[0].refcount == 0) {
                      if (local_338[0].allocator == (Allocator *)0x0) {
                        if ((size_t *)local_338[0].data != (size_t *)0x0) {
                          free(local_338[0].data);
                        }
                      }
                      else {
                        (*(local_338[0].allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  if ((iVar13 != 0xe) && (iVar13 != 0)) goto LAB_00149599;
                }
                else {
                  fprintf(_stderr,"ParamDict load_param %d %s failed",uVar18 & 0xffffffff,
                          (local_368->_M_dataplus)._M_p);
                  fputc(10,_stderr);
                }
                uVar18 = uVar18 + 1;
              } while ((long)uVar18 < (long)local_39c);
            }
            NetPrivate::update_input_output_indexes(this->d);
            iVar13 = 0;
            NetPrivate::update_input_output_names(this->d);
LAB_0014959e:
            ParamDict::~ParamDict(&local_350);
            return iVar13;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}